

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_int.c
# Opt level: O1

int mpt_culong(unsigned_long *val,char *src,int base,unsigned_long *range)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  unsigned_long tmp;
  ulong local_18;
  
  local_18 = in_RAX;
  iVar1 = _mpt_convert_uint(&local_18,8,src,base);
  iVar2 = iVar1;
  if ((0 < iVar1) &&
     (((range == (unsigned_long *)0x0 ||
       ((iVar2 = -2, *range <= local_18 && (local_18 <= range[1])))) &&
      (iVar2 = iVar1, val != (unsigned_long *)0x0)))) {
    *val = local_18;
  }
  return iVar2;
}

Assistant:

extern int _mpt_convert_uint(void *val, size_t vlen, const char *src, int base)
{
	uintmax_t tmp;
	char *end;
	
	if (!(end = (char *) src)) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	/* max size unsigend integer */
	tmp = strtoumax(src, &end, base);
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	switch (vlen) {
	  case sizeof(int8_t) :
		if (tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int8_t *) val) = tmp;
		break;
	  case sizeof(int16_t):
		if (tmp > UINT16_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int16_t *) val) = tmp;
		break;
	  case sizeof(int32_t):
		if (tmp > UINT32_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int32_t *) val) = tmp;
		break;
	  case sizeof(int64_t):
		if (tmp > UINT64_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int64_t *) val) = tmp;
		break;
	  default:
		return MPT_ERROR(BadType);
	}
	return end - src;
}